

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall HighsSparseMatrix::createColwise(HighsSparseMatrix *this,HighsSparseMatrix *matrix)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  uint uVar9;
  size_type __new_size;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  vector<int,_std::allocator<int>_> a_end;
  vector<int,_std::allocator<int>_> local_58;
  value_type_conflict2 local_34;
  
  uVar1 = matrix->num_col_;
  uVar2 = matrix->num_row_;
  uVar9 = uVar2;
  if (matrix->format_ == kColwise) {
    uVar9 = uVar1;
  }
  __new_size = (size_type)
               (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar9];
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->start_,(long)(int)uVar1 + 1);
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_58,(long)(int)uVar1,&local_34);
  if (0 < (int)uVar2) {
    piVar4 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = *piVar4;
    uVar12 = 0;
    do {
      lVar11 = uVar12 + 1;
      uVar12 = uVar12 + 1;
      iVar3 = piVar4[lVar11];
      if (iVar10 < piVar4[lVar11]) {
        lVar11 = (long)iVar10;
        do {
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[piVar5[lVar11]] =
               local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[piVar5[lVar11]] + 1;
          lVar11 = lVar11 + 1;
          iVar3 = piVar4[uVar12];
        } while (lVar11 < piVar4[uVar12]);
      }
      iVar10 = iVar3;
    } while (uVar12 != uVar2);
  }
  piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar4 = 0;
  if (0 < (int)uVar1) {
    uVar12 = 0;
    do {
      piVar4[uVar12 + 1] =
           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar12] + piVar4[uVar12];
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar12] = piVar4[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar1 != uVar12);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->index_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,__new_size);
  if (0 < (int)uVar2) {
    piVar4 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = *piVar4;
    uVar12 = 0;
    do {
      uVar13 = uVar12 + 1;
      iVar3 = piVar4[uVar12 + 1];
      if (iVar10 < piVar4[uVar12 + 1]) {
        lVar11 = (long)iVar10;
        do {
          iVar10 = piVar5[lVar11];
          iVar3 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar10];
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar10] = iVar3 + 1;
          piVar6[iVar3] = (int)uVar12;
          pdVar8[iVar3] = pdVar7[lVar11];
          lVar11 = lVar11 + 1;
          iVar3 = piVar4[uVar13];
        } while (lVar11 < piVar4[uVar13]);
      }
      iVar10 = iVar3;
      uVar12 = uVar13;
    } while (uVar13 != uVar2);
  }
  this->format_ = kColwise;
  this->num_col_ = uVar1;
  this->num_row_ = uVar2;
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsSparseMatrix::createColwise(const HighsSparseMatrix& matrix) {
  assert(matrix.formatOk());
  assert(matrix.isRowwise());
  assert(this->formatOk());

  HighsInt num_col = matrix.num_col_;
  HighsInt num_row = matrix.num_row_;
  HighsInt num_nz = matrix.numNz();
  const vector<HighsInt>& ar_start = matrix.start_;
  const vector<HighsInt>& ar_index = matrix.index_;
  const vector<double>& ar_value = matrix.value_;
  vector<HighsInt>& a_start = this->start_;
  vector<HighsInt>& a_index = this->index_;
  vector<double>& a_value = this->value_;

  // Use a_end to compute lengths, which are then transformed into
  // the ends of the inserted entries
  std::vector<HighsInt> a_end;
  a_start.resize(num_col + 1);
  a_end.assign(num_col, 0);
  // Count the nonzeros in each col
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++) {
      HighsInt iCol = ar_index[iEl];
      a_end[iCol]++;
    }
  }
  // Compute the starts and turn the lengths into ends
  a_start[0] = 0;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    a_start[iCol + 1] = a_start[iCol] + a_end[iCol];
    a_end[iCol] = a_start[iCol];
  }
  a_index.resize(num_nz);
  a_value.resize(num_nz);
  // Insert the entries
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++) {
      HighsInt iCol = ar_index[iEl];
      HighsInt iToEl = a_end[iCol]++;
      a_index[iToEl] = iRow;
      a_value[iToEl] = ar_value[iEl];
    }
  }
  this->format_ = MatrixFormat::kColwise;
  this->num_col_ = num_col;
  this->num_row_ = num_row;
}